

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluDrawUtil.cpp
# Opt level: O0

void glu::anon_unknown_4::copyToLayout
               (void *dstBasePtr,VertexAttributeDescriptor *dstVA,VertexArrayPointer *srcPtr)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  int local_40;
  int local_3c;
  int local_34;
  int ndx;
  int srcStride;
  int dstStride;
  bool dstHasCustomStride;
  bool srcHasCustomStride;
  int elementSize;
  VertexArrayPointer *srcPtr_local;
  VertexAttributeDescriptor *dstVA_local;
  void *dstBasePtr_local;
  
  iVar1 = getVtxCompSize(dstVA->componentType);
  iVar1 = iVar1 * dstVA->numComponents;
  bVar2 = false;
  if (srcPtr->stride != 0) {
    bVar2 = srcPtr->stride != iVar1;
  }
  bVar3 = false;
  if (dstVA->stride != 0) {
    bVar3 = dstVA->stride != iVar1;
  }
  if ((bVar2) || (bVar3)) {
    local_3c = iVar1;
    if (dstVA->stride != 0) {
      local_3c = dstVA->stride;
    }
    local_40 = iVar1;
    if (srcPtr->stride != 0) {
      local_40 = srcPtr->stride;
    }
    for (local_34 = 0; local_34 < dstVA->numElements; local_34 = local_34 + 1) {
      deMemcpy((void *)((long)dstBasePtr + (long)dstVA->pointer + (long)(local_34 * local_3c)),
               (void *)((long)srcPtr->data + (long)(local_34 * local_40)),(long)iVar1);
    }
  }
  else {
    deMemcpy((void *)((long)dstBasePtr + (long)dstVA->pointer),srcPtr->data,
             (long)(iVar1 * dstVA->numElements));
  }
  return;
}

Assistant:

static void copyToLayout (void* dstBasePtr, const VertexAttributeDescriptor& dstVA, const VertexArrayPointer& srcPtr)
{
	DE_ASSERT(dstVA.componentType	== srcPtr.componentType &&
			  dstVA.numComponents	== srcPtr.numComponents &&
			  dstVA.numElements		== srcPtr.numElements);

	const int	elementSize			= getVtxCompSize(dstVA.componentType)*dstVA.numComponents;
	const bool	srcHasCustomStride	= srcPtr.stride != 0 && srcPtr.stride != elementSize;
	const bool	dstHasCustomStride	= dstVA.stride != 0 && dstVA.stride != elementSize;

	if (srcHasCustomStride || dstHasCustomStride)
	{
		const int	dstStride	= dstVA.stride != 0 ? dstVA.stride : elementSize;
		const int	srcStride	= srcPtr.stride != 0 ? srcPtr.stride : elementSize;

		for (int ndx = 0; ndx < dstVA.numElements; ndx++)
			deMemcpy((deUint8*)dstBasePtr + (deUintptr)dstVA.pointer + ndx*dstStride, (const deUint8*)srcPtr.data + ndx*srcStride, elementSize);
	}
	else
		deMemcpy((deUint8*)dstBasePtr + (deUintptr)dstVA.pointer, srcPtr.data, elementSize*dstVA.numElements);
}